

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgenfil.cpp
# Opt level: O2

void __thiscall CTcDataStream::write_to_object_file(CTcDataStream *this,CVmFile *fp)

{
  ulong uVar1;
  uint32_t tmp;
  CTcStreamAnchor *pCVar2;
  CTcSymbol *pCVar3;
  uint v;
  char *buf_00;
  size_t sVar4;
  CTcStreamAnchor *pCVar5;
  ulong uVar6;
  char buf [6];
  
  CVmFile::write_uint4(fp,(uint)this->ofs_);
  uVar6 = 0;
  while( true ) {
    uVar1 = this->ofs_;
    sVar4 = uVar1 - uVar6;
    if (uVar1 < uVar6 || sVar4 == 0) break;
    if (uVar6 + 65000 <= uVar1) {
      sVar4 = 65000;
    }
    CVmFile::write_bytes(fp,this->pages_[uVar6 / 65000] + uVar6 % 65000,sVar4);
    uVar6 = uVar6 + sVar4;
  }
  pCVar5 = (CTcStreamAnchor *)&this->first_anchor_;
  v = 0xffffffff;
  pCVar2 = pCVar5;
  do {
    pCVar2 = pCVar2->nxt_;
    v = v + 1;
  } while (pCVar2 != (CTcStreamAnchor *)0x0);
  CVmFile::write_uint4(fp,v);
  while (pCVar5 = pCVar5->nxt_, pCVar5 != (CTcStreamAnchor *)0x0) {
    buf._0_4_ = *(undefined4 *)&pCVar5->ofs_;
    if ((pCVar5->fixup_info_).fixup_owner_sym_ == (CTcSymbol *)0x0 ||
        (anon_union_8_2_4a88f83c_for_fixup_info_ *)pCVar5->fixup_list_head_ == &pCVar5->fixup_info_)
    {
      buf[4] = '\0';
      buf[5] = '\0';
      sVar4 = 6;
      buf_00 = buf;
    }
    else {
      buf._4_2_ = *(undefined2 *)
                   &(((pCVar5->fixup_info_).fixup_owner_sym_)->super_CTcSymbolBase).
                    super_CVmHashEntryCS.super_CVmHashEntry.len_;
      CVmFile::write_bytes(fp,buf,6);
      if ((anon_union_8_2_4a88f83c_for_fixup_info_ *)pCVar5->fixup_list_head_ ==
          &pCVar5->fixup_info_) {
        pCVar3 = (CTcSymbol *)0x0;
      }
      else {
        pCVar3 = (pCVar5->fixup_info_).fixup_owner_sym_;
      }
      buf_00 = (pCVar3->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.str_;
      sVar4 = (pCVar3->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.len_;
    }
    CVmFile::write_bytes(fp,buf_00,sVar4);
    CTcAbsFixup::write_fixup_list_to_object_file(fp,*pCVar5->fixup_list_head_);
  }
  return;
}

Assistant:

void CTcDataStream::write_to_object_file(CVmFile *fp)
{
    ulong ofs;
    CTcStreamAnchor *anchor;
    long cnt;

    /* 
     *   First, write the data stream bytes.  Write the length prefix
     *   followed by the data.  Just blast the whole thing out in one huge
     *   byte stream, one page at a time.  
     */
    fp->write_uint4(ofs_);

    /* write the data one page at a time */
    for (ofs = 0 ; ofs < ofs_ ; )
    {
        size_t cur;

        /* 
         *   write out one whole page, or the balance of the current page if
         *   we have less than a whole page remaining 
         */
        cur = TCCS_PAGE_SIZE;
        if (ofs + cur > ofs_)
            cur = (size_t)(ofs_ - ofs);

        /* write out this chunk */
        fp->write_bytes(calc_addr(ofs), cur);

        /* move to the next page's offset */
        ofs += cur;
    }

    /* count the anchors */
    for (cnt = 0, anchor = first_anchor_ ; anchor != 0 ;
         anchor = anchor->nxt_, ++cnt) ;

    /* write the count */
    fp->write_uint4(cnt);

    /*
     *   Write all of the anchors, and all of their fixups.  (We have the
     *   code to write the anchor and fixup information in-line here for
     *   efficiency - there will normally be a large number of these tiny
     *   objects, so anything we can do to improve the speed of this loop
     *   will help quite a lot in the overall write performance.)  
     */
    for (anchor = first_anchor_ ; anchor != 0 ; anchor = anchor->nxt_)
    {
        char buf[6];

        /* write the stream offset */
        oswp4(buf, anchor->get_ofs());

        /* 
         *   If the anchor has an external fixup list, write the symbol's
         *   name to the file; otherwise write a zero length to indicate that
         *   we have an internal fixup list.  
         */
        if (anchor->get_fixup_owner_sym() == 0)
        {
            /* no external list - indicate with a zero symbol length */
            oswp2(buf+4, 0);
            fp->write_bytes(buf, 6);
        }
        else
        {
            /* external list - write the symbol length and name */
            oswp2(buf+4, anchor->get_fixup_owner_sym()->get_sym_len());
            fp->write_bytes(buf, 6);
            fp->write_bytes(anchor->get_fixup_owner_sym()->get_sym(),
                            anchor->get_fixup_owner_sym()->get_sym_len());
        }

        /* write the fixup list */
        CTcAbsFixup::
            write_fixup_list_to_object_file(fp, *anchor->fixup_list_head_);
    }
}